

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O1

void __thiscall RK4::Integrate(RK4 *this)

{
  Mat *rhs;
  double t;
  double h;
  clock_t cVar1;
  clock_t cVar2;
  int iVar3;
  int iCol;
  Mat input;
  Mat local_70;
  Mat local_60;
  Mat local_50;
  Mat local_40;
  
  cVar1 = clock();
  iVar3 = (int)((double)(int)(this->t_final_ - this->t_initial_) / this->h_);
  this->t_out_ = this->t_initial_;
  rhs = &this->y_out_;
  Mat::operator=(&local_40,rhs);
  Mat::~Mat(&local_40);
  if (0 < iVar3) {
    iCol = 0;
    do {
      Mat::GetCol(&local_50,(int)this + 0x78);
      t = this->t_out_;
      h = this->h_;
      Mat::Mat(&local_60,&local_50);
      Step(this,t,rhs,h,&local_60);
      Mat::~Mat(&local_60);
      Mat::Mat(&local_70,rhs);
      iCol = iCol + 1;
      Mat::SetCol(&this->Y_Out_,iCol,&local_70);
      Mat::~Mat(&local_70);
      Mat::~Mat(&local_50);
    } while (iVar3 != iCol);
  }
  cVar2 = clock();
  this->time_ = (double)(cVar2 - cVar1) + this->time_;
  return;
}

Assistant:

void RK4::Integrate()
{
	clock_t t1 = clock();	
	int steps2 = (int)(t_final_ - t_initial_) / h_;
	t_out_ = t_initial_;
	y_out_ = y_0_;
	for (int i = 0; i < steps2; i++)
	{
		Mat input = u_vec_.GetCol(i);
		Step(t_out_, y_out_, h_, input);
		Y_Out_.SetCol(i+1, y_out_);
	}
	time_ += (clock()-t1);
}